

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::IncDecVerify(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,"Verifying Increment-decrement:");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  PreIncTestUint8();
  PostIncTestUint8();
  PreIncTestUint16();
  PostIncTestUint16();
  PreIncTestUint32();
  PostIncTestUint32();
  PreIncTestUint64();
  PostIncTestUint64();
  PreIncTestInt8();
  PostIncTestInt8();
  PreIncTestInt16();
  PostIncTestInt16();
  PreIncTestInt32();
  PostIncTestInt32();
  PreIncTestInt64();
  PostIncTestInt64();
  PostDecTestUint8();
  PreDecTestUint16();
  PostDecTestUint16();
  PreDecTestUint32();
  PostDecTestUint32();
  PreDecTestUint64();
  PostDecTestUint64();
  PreDecTestInt8();
  PostDecTestInt8();
  PreDecTestInt16();
  PostDecTestInt16();
  PreDecTestInt32();
  PostDecTestInt32();
  PreDecTestInt64();
  PostDecTestInt64();
  return;
}

Assistant:

void IncDecVerify()
{
   std::cout << "Verifying Increment-decrement:" << std::endl;
	PreIncTestUint8();
	PostIncTestUint8();
	PreIncTestUint16();
	PostIncTestUint16();
	PreIncTestUint32();
	PostIncTestUint32();
	PreIncTestUint64();
	PostIncTestUint64();

	PreIncTestInt8();
	PostIncTestInt8();
	PreIncTestInt16();
	PostIncTestInt16();
	PreIncTestInt32();
	PostIncTestInt32();
	PreIncTestInt64();
	PostIncTestInt64();

	PostDecTestUint8();
	PreDecTestUint16();
	PostDecTestUint16();
	PreDecTestUint32();
	PostDecTestUint32();
	PreDecTestUint64();
	PostDecTestUint64();

	PreDecTestInt8();
	PostDecTestInt8();
	PreDecTestInt16();
	PostDecTestInt16();
	PreDecTestInt32();
	PostDecTestInt32();
	PreDecTestInt64();
	PostDecTestInt64();
}